

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_box_set.cpp
# Opt level: O2

uint __thiscall
GIM_BOX_TREE::_sort_and_calc_splitting_index
          (GIM_BOX_TREE *this,gim_array<GIM_AABB_DATA> *primitive_boxes,uint startIndex,
          uint endIndex,uint splitAxis)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  ulong uVar6;
  float *pfVar7;
  uint uVar8;
  uint uVar9;
  uint j;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 in_XMM3 [16];
  
  uVar10 = (ulong)startIndex;
  auVar11 = ZEXT816(0) << 0x40;
  pfVar7 = (float *)(*(long *)primitive_boxes + 0x10 + uVar10 * 0x24 + (ulong)splitAxis * 4);
  uVar6 = uVar10;
  while (uVar6 < endIndex) {
    fVar2 = *pfVar7;
    uVar6 = uVar6 + 1;
    pfVar1 = pfVar7 + -4;
    pfVar7 = pfVar7 + 9;
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)(fVar2 + *pfVar1)),
                              SUB6416(ZEXT464(0x3f000000),0));
  }
  uVar8 = endIndex - startIndex;
  lVar5 = uVar10 * 0x24 + 0x10 + (ulong)splitAxis * 4;
  auVar3 = vcvtusi2ss_avx512f(in_XMM3,uVar8);
  j = startIndex;
  for (; uVar10 < endIndex; uVar10 = uVar10 + 1) {
    if (auVar11._0_4_ / auVar3._0_4_ <
        (*(float *)(*(long *)primitive_boxes + lVar5) +
        *(float *)(*(long *)primitive_boxes + -0x10 + lVar5)) * 0.5) {
      gim_array<GIM_AABB_DATA>::swap(primitive_boxes,(uint)uVar10,j);
      j = j + 1;
    }
    lVar5 = lVar5 + 0x24;
  }
  uVar9 = (uVar8 >> 1) + startIndex;
  uVar4 = j;
  if (~(uVar8 / 3) + endIndex <= j) {
    uVar4 = uVar9;
  }
  if (j <= uVar8 / 3 + startIndex) {
    uVar4 = uVar9;
  }
  return uVar4;
}

Assistant:

GUINT GIM_BOX_TREE::_sort_and_calc_splitting_index(
	gim_array<GIM_AABB_DATA>& primitive_boxes, GUINT startIndex,
	GUINT endIndex, GUINT splitAxis)
{
	GUINT i;
	GUINT splitIndex = startIndex;
	GUINT numIndices = endIndex - startIndex;

	// average of centers
	cbtScalar splitValue = 0.0f;
	for (i = startIndex; i < endIndex; i++)
	{
		splitValue += 0.5f * (primitive_boxes[i].m_bound.m_max[splitAxis] +
							  primitive_boxes[i].m_bound.m_min[splitAxis]);
	}
	splitValue /= (cbtScalar)numIndices;

	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i = startIndex; i < endIndex; i++)
	{
		cbtScalar center = 0.5f * (primitive_boxes[i].m_bound.m_max[splitAxis] +
								  primitive_boxes[i].m_bound.m_min[splitAxis]);
		if (center > splitValue)
		{
			//swap
			primitive_boxes.swap(i, splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	GUINT rangeBalancedIndices = numIndices / 3;
	bool unbalanced = ((splitIndex <= (startIndex + rangeBalancedIndices)) || (splitIndex >= (endIndex - 1 - rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex + (numIndices >> 1);
	}

	cbtAssert(!((splitIndex == startIndex) || (splitIndex == (endIndex))));

	return splitIndex;
}